

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomname(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  int iVar2;
  matches *pmVar3;
  expr *peVar4;
  expr **ppeVar5;
  
  if (ctx->reverse != 0) {
    pmVar3 = matchid(ctx,spos,(char *)v);
    return pmVar3;
  }
  peVar4 = (expr *)calloc(0x48,1);
  peVar4->type = EXPR_ID;
  peVar4->str = (char *)v;
  iVar1 = ctx->atomsmax;
  if (iVar1 <= ctx->atomsnum) {
    iVar2 = 0x10;
    if (iVar1 != 0) {
      iVar2 = iVar1 * 2;
    }
    ctx->atomsmax = iVar2;
    ppeVar5 = (expr **)realloc(ctx->atoms,(long)iVar2 << 3);
    ctx->atoms = ppeVar5;
  }
  iVar1 = ctx->atomsnum;
  ctx->atomsnum = iVar1 + 1;
  ctx->atoms[iVar1] = peVar4;
  return (matches *)0x0;
}

Assistant:

struct matches *atomname APROTO {
	if (!ctx->reverse) {
		struct expr *expr = makeex(EXPR_ID);
		expr->str = v;
		ADDARRAY(ctx->atoms, expr);
		return NULL;
	} else {
		return matchid(ctx, spos, v);
	}
}